

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3InsertBuiltinFuncs(FuncDef *aDef,int nDef)

{
  byte *__s;
  uint uVar1;
  size_t sVar2;
  FuncDef *pFVar3;
  FuncDef **ppFVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < nDef) {
    uVar6 = (ulong)(uint)nDef;
    do {
      __s = (byte *)aDef->zName;
      if (__s == (byte *)0x0) {
        uVar1 = 0;
      }
      else {
        sVar2 = strlen((char *)__s);
        uVar1 = (uint)sVar2 & 0x3fffffff;
      }
      uVar1 = ""[*__s] + uVar1;
      uVar1 = uVar1 / 0x17 + (uVar1 / 0x17) * -0x18 + uVar1;
      pFVar3 = functionSearch(uVar1,(char *)__s);
      if (pFVar3 == (FuncDef *)0x0) {
        aDef->pNext = (FuncDef *)0x0;
        ppFVar4 = sqlite3BuiltinFunctions.a + uVar1;
        lVar5 = 0x30;
      }
      else {
        ppFVar4 = &pFVar3->pNext;
        lVar5 = 0x10;
      }
      *(FuncDef **)(&aDef->nArg + lVar5) = *ppFVar4;
      *ppFVar4 = aDef;
      aDef = aDef + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InsertBuiltinFuncs(
  FuncDef *aDef,      /* List of global functions to be inserted */
  int nDef            /* Length of the apDef[] list */
){
  int i;
  for(i=0; i<nDef; i++){
    FuncDef *pOther;
    const char *zName = aDef[i].zName;
    int nName = sqlite3Strlen30(zName);
    int h = (sqlite3UpperToLower[(u8)zName[0]] + nName) % SQLITE_FUNC_HASH_SZ;
    pOther = functionSearch(h, zName);
    if( pOther ){
      assert( pOther!=&aDef[i] && pOther->pNext!=&aDef[i] );
      aDef[i].pNext = pOther->pNext;
      pOther->pNext = &aDef[i];
    }else{
      aDef[i].pNext = 0;
      aDef[i].u.pHash = sqlite3BuiltinFunctions.a[h];
      sqlite3BuiltinFunctions.a[h] = &aDef[i];
    }
  }
}